

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  reference pvVar5;
  int *actual_write_size;
  vector<double,_std::allocator<double>_> *this;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_18;
  ostringstream error_message_17;
  vector<double,_std::allocator<double>_> output_1;
  vector<double,_std::allocator<double>_> waveform;
  int output_length_1;
  ostringstream error_message_16;
  Buffer buffer_1;
  WaveformToSpectrum waveform_to_spectrum;
  istream *input_stream;
  ostringstream error_message_15;
  ifstream ifs;
  char *input_file;
  ostringstream error_message_14;
  int num_input_files_1;
  ostringstream error_message_13;
  ostringstream error_message_12;
  vector<double,_std::allocator<double>_> output;
  int output_length;
  ostringstream error_message_11;
  Buffer buffer;
  FilterCoefficientsToSpectrum filter_coefficients_to_spectrum;
  istream *input_stream_for_denominator;
  ostringstream error_message_10;
  ifstream ifs_for_denominator;
  istream *input_stream_for_numerator;
  ostringstream error_message_9;
  ifstream ifs_for_numerator;
  ostringstream error_message_8;
  int num_input_files;
  ostringstream error_message_7;
  vector<double,_std::allocator<double>_> denominator_coefficients;
  vector<double,_std::allocator<double>_> numerator_coefficients;
  int denominator_length;
  int numerator_length;
  ostringstream error_message_6;
  ostringstream error_message_5;
  int tmp;
  int max;
  int min;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  InputOutputFormats output_format;
  double relative_floor_in_decibels;
  double epsilon;
  bool is_denominator_specified;
  bool is_numerator_specified;
  char *denominator_coefficients_file;
  char *numerator_coefficients_file;
  int num_denominator_order;
  int num_numerator_order;
  int fft_length;
  option *in_stack_ffffffffffffd2f8;
  Buffer *buffer_00;
  WaveformToSpectrum *in_stack_ffffffffffffd300;
  undefined7 in_stack_ffffffffffffd308;
  undefined1 in_stack_ffffffffffffd30f;
  WaveformToSpectrum *in_stack_ffffffffffffd310;
  undefined6 in_stack_ffffffffffffd318;
  undefined1 in_stack_ffffffffffffd31e;
  undefined1 in_stack_ffffffffffffd31f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd320;
  double in_stack_ffffffffffffd328;
  int *in_stack_ffffffffffffd330;
  istream *in_stack_ffffffffffffd338;
  istream *input_stream_00;
  FilterCoefficientsToSpectrum *in_stack_ffffffffffffd340;
  allocator *paVar6;
  int in_stack_ffffffffffffd348;
  int in_stack_ffffffffffffd34c;
  int read_point;
  ostream *in_stack_ffffffffffffd350;
  WaveformToSpectrum *this_00;
  int *in_stack_ffffffffffffd360;
  char *local_2c78;
  bool local_2c43;
  bool local_2c42;
  char *local_2c20;
  char *local_2be8;
  byte local_2b3a;
  Buffer *in_stack_ffffffffffffd4c8;
  allocator *in_stack_ffffffffffffd4d0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd4d8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd4e0;
  ostringstream *this_01;
  undefined5 in_stack_ffffffffffffd4e8;
  byte in_stack_ffffffffffffd4ed;
  undefined1 in_stack_ffffffffffffd4ee;
  undefined1 in_stack_ffffffffffffd4ef;
  string *in_stack_ffffffffffffd4f0;
  bool local_2aea;
  bool local_2ac2;
  bool local_2a9a;
  undefined1 local_2a51 [33];
  ostringstream local_2a30 [383];
  undefined1 local_28b1 [33];
  ostringstream local_2890 [415];
  istream local_26f1 [25];
  int local_26d8;
  allocator local_26d1;
  string local_26d0 [32];
  ostringstream local_26b0 [808];
  WaveformToSpectrum *local_2388;
  allocator local_2379;
  string local_2378 [32];
  ostringstream local_2358 [376];
  WaveformToSpectrum local_21e0 [2];
  char *local_1fd8;
  allocator local_1fc9;
  string local_1fc8 [32];
  ostringstream local_1fa8 [376];
  int local_1e30;
  allocator local_1e29;
  string local_1e28 [32];
  ostringstream local_1e08 [383];
  allocator local_1c89;
  string local_1c88 [32];
  ostringstream local_1c68 [408];
  int local_1ad0;
  allocator local_1ac9;
  string local_1ac8 [32];
  ostringstream local_1aa8 [560];
  FilterCoefficientsToSpectrum local_1878;
  char *local_17a8;
  allocator local_1799;
  string local_1798 [32];
  ostringstream local_1778 [376];
  char local_1600 [520];
  char *local_13f8;
  allocator local_13e9;
  string local_13e8 [32];
  ostringstream local_13c8 [376];
  char local_1250 [527];
  allocator local_1041;
  string local_1040 [32];
  ostringstream local_1020 [380];
  int local_ea4;
  int local_ea0;
  allocator local_e99;
  string local_e98 [32];
  ostringstream local_e78 [384];
  vector<double,_std::allocator<double>_> local_cf8;
  vector<double,_std::allocator<double>_> local_cd8;
  int local_cbc;
  int local_cb8;
  allocator local_cb1;
  string local_cb0 [32];
  ostringstream local_c90 [383];
  allocator local_b11;
  string local_b10 [32];
  ostringstream local_af0 [383];
  allocator local_971;
  string local_970 [32];
  int local_950;
  undefined4 local_94c;
  undefined4 local_948;
  allocator local_941;
  string local_940 [32];
  ostringstream local_920 [383];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [32];
  ostringstream local_758 [383];
  allocator local_5d9;
  string local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [32];
  ostringstream local_590 [383];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  ostringstream local_3c8 [383];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  ostringstream local_200 [399];
  allocator local_71;
  string local_70 [32];
  int local_50;
  int local_4c;
  double local_48;
  double local_40;
  byte local_32;
  byte local_31;
  char *local_30;
  char *local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x100;
  local_18 = 0;
  local_1c = 0;
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_31 = 0;
  local_32 = 0;
  local_40 = 0.0;
  local_48 = -1.79769313486232e+308;
  local_4c = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_50 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffd310 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffd30f,
                                                     in_stack_ffffffffffffd308),
                                   (char *)in_stack_ffffffffffffd300,in_stack_ffffffffffffd2f8,
                                   (int *)0x104875), pcVar1 = ya_optarg, local_50 != -1) {
    switch(local_50) {
    case 0x45:
      in_stack_ffffffffffffd4f0 = (string *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a0,(char *)in_stack_ffffffffffffd4f0,&local_7a1);
      in_stack_ffffffffffffd4ef =
           sptk::ConvertStringToDouble
                     ((string *)CONCAT17(in_stack_ffffffffffffd30f,in_stack_ffffffffffffd308),
                      (double *)in_stack_ffffffffffffd300);
      in_stack_ffffffffffffd4ed = !(bool)in_stack_ffffffffffffd4ef || 0.0 <= local_48;
      in_stack_ffffffffffffd4ee = in_stack_ffffffffffffd4ed;
      std::__cxx11::string::~string(local_7a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
      if ((in_stack_ffffffffffffd4ed & 1) != 0) {
        this_01 = local_920;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,
                        "The argument for the -E option must be a negative number");
        paVar6 = &local_941;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_940,"spec",paVar6);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd4f0,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd4ef,
                            CONCAT16(in_stack_ffffffffffffd4ee,
                                     CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)))
                  );
        std::__cxx11::string::~string(local_940);
        std::allocator<char>::~allocator((allocator<char> *)&local_941);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_920);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1739::PrintUsage(in_stack_ffffffffffffd350);
      return 1;
    case 0x65:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d8,pcVar1,&local_5d9);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffd30f,in_stack_ffffffffffffd308),
                         (double *)in_stack_ffffffffffffd300);
      local_2aea = !bVar2 || local_40 <= 0.0;
      std::__cxx11::string::~string(local_5d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
      if (local_2aea) {
        std::__cxx11::ostringstream::ostringstream(local_758);
        std::operator<<((ostream *)local_758,
                        "The argument for the -e option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_778,"spec",&local_779);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd4f0,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd4ef,
                            CONCAT16(in_stack_ffffffffffffd4ee,
                                     CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)))
                  );
        std::__cxx11::string::~string(local_778);
        std::allocator<char>::~allocator((allocator<char> *)&local_779);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_758);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_1739::PrintUsage(in_stack_ffffffffffffd350);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar1,&local_71);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd30f,in_stack_ffffffffffffd308),
                         (int *)in_stack_ffffffffffffd300);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_200);
        std::operator<<((ostream *)local_200,"The argument for the -l option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,"spec",&local_221);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd4f0,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd4ef,
                            CONCAT16(in_stack_ffffffffffffd4ee,
                                     CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)))
                  );
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_200);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,pcVar1,&local_249);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd30f,in_stack_ffffffffffffd308),
                         (int *)in_stack_ffffffffffffd300);
      local_2a9a = !bVar2 || local_18 < 0;
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      if (local_2a9a) {
        std::__cxx11::ostringstream::ostringstream(local_3c8);
        std::operator<<((ostream *)local_3c8,
                        "The argument for the -m option must be a non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3e8,"spec",&local_3e9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd4f0,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd4ef,
                            CONCAT16(in_stack_ffffffffffffd4ee,
                                     CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)))
                  );
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3c8);
        return local_4;
      }
      local_31 = 1;
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,pcVar1,&local_411);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd30f,in_stack_ffffffffffffd308),
                         (int *)in_stack_ffffffffffffd300);
      local_2ac2 = !bVar2 || local_1c < 0;
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      if (local_2ac2) {
        std::__cxx11::ostringstream::ostringstream(local_590);
        std::operator<<((ostream *)local_590,
                        "The argument for the -n option must be a non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5b0,"spec",&local_5b1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd4f0,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd4ef,
                            CONCAT16(in_stack_ffffffffffffd4ee,
                                     CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)))
                  );
        std::__cxx11::string::~string(local_5b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_590);
        return local_4;
      }
      local_32 = 1;
      break;
    case 0x6f:
      local_948 = 0;
      local_94c = 3;
      in_stack_ffffffffffffd4d0 = &local_971;
      in_stack_ffffffffffffd4c8 = (Buffer *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_970,(char *)in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4d0);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd30f,in_stack_ffffffffffffd308),
                         (int *)in_stack_ffffffffffffd300);
      local_2b3a = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_950,0,3);
        local_2b3a = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_970);
      std::allocator<char>::~allocator((allocator<char> *)&local_971);
      if ((local_2b3a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_af0);
        poVar4 = std::operator<<((ostream *)local_af0,
                                 "The argument for the -o option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b10,"spec",&local_b11);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd4f0,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd4ef,
                            CONCAT16(in_stack_ffffffffffffd4ee,
                                     CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)))
                  );
        std::__cxx11::string::~string(local_b10);
        std::allocator<char>::~allocator((allocator<char> *)&local_b11);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af0);
        return local_4;
      }
      local_4c = local_950;
      break;
    case 0x70:
      local_30 = ya_optarg;
      local_32 = 1;
      break;
    case 0x7a:
      local_28 = ya_optarg;
      local_31 = 1;
    }
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_c90);
    std::operator<<((ostream *)local_c90,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cb0,"spec",&local_cb1);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd4f0,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd4ef,
                        CONCAT16(in_stack_ffffffffffffd4ee,
                                 CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8))));
    std::__cxx11::string::~string(local_cb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c90);
    return local_4;
  }
  if (((local_31 & 1) != 0) || ((local_32 & 1) != 0)) {
    local_cb8 = local_18 + 1;
    local_cbc = local_1c + 1;
    std::allocator<double>::allocator((allocator<double> *)0x105864);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffd320,
               CONCAT17(in_stack_ffffffffffffd31f,
                        CONCAT16(in_stack_ffffffffffffd31e,in_stack_ffffffffffffd318)),
               (allocator_type *)in_stack_ffffffffffffd310);
    std::allocator<double>::~allocator((allocator<double> *)0x105890);
    std::allocator<double>::allocator((allocator<double> *)0x1058b5);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffd320,
               CONCAT17(in_stack_ffffffffffffd31f,
                        CONCAT16(in_stack_ffffffffffffd31e,in_stack_ffffffffffffd318)),
               (allocator_type *)in_stack_ffffffffffffd310);
    std::allocator<double>::~allocator((allocator<double> *)0x1058e1);
    if ((((local_31 & 1) == 0) || ((local_32 & 1) == 0)) ||
       ((local_28 != (char *)0x0 && (local_30 != (char *)0x0)))) {
      local_ea4 = local_8 - ya_optind;
      if (local_ea4 < 1) {
        std::ifstream::ifstream(local_1250);
        pcVar1 = local_28;
        if (((local_31 & 1) == 0) || (local_28 == (char *)0x0)) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_cd8,0);
          *pvVar5 = 1.0;
LAB_00105df7:
          bVar3 = std::ifstream::is_open();
          if ((bVar3 & 1) == 0) {
            local_2be8 = (char *)&std::cin;
          }
          else {
            local_2be8 = local_1250;
          }
          local_13f8 = local_2be8;
          std::ifstream::ifstream(local_1600);
          pcVar1 = local_30;
          if (((local_32 & 1) == 0) || (local_30 == (char *)0x0)) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_cf8,0);
            *pvVar5 = 1.0;
LAB_00106066:
            bVar3 = std::ifstream::is_open();
            if ((bVar3 & 1) == 0) {
              local_2c20 = (char *)&std::cin;
            }
            else {
              local_2c20 = local_1600;
            }
            local_17a8 = local_2c20;
            sptk::FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
                      (in_stack_ffffffffffffd340,(int)((ulong)in_stack_ffffffffffffd338 >> 0x20),
                       (int)in_stack_ffffffffffffd338,
                       (int)((ulong)in_stack_ffffffffffffd330 >> 0x20),
                       (InputOutputFormats)in_stack_ffffffffffffd330,in_stack_ffffffffffffd328,
                       (double)in_stack_ffffffffffffd320);
            sptk::FilterCoefficientsToSpectrum::Buffer::Buffer((Buffer *)in_stack_ffffffffffffd300);
            bVar2 = sptk::FilterCoefficientsToSpectrum::IsValid(&local_1878);
            if (bVar2) {
              local_1ad0 = local_14 / 2 + 1;
              std::allocator<double>::allocator((allocator<double> *)0x1062bd);
              std::vector<double,_std::allocator<double>_>::vector
                        (in_stack_ffffffffffffd320,
                         CONCAT17(in_stack_ffffffffffffd31f,
                                  CONCAT16(in_stack_ffffffffffffd31e,in_stack_ffffffffffffd318)),
                         (allocator_type *)in_stack_ffffffffffffd310);
              std::allocator<double>::~allocator((allocator<double> *)0x1062e9);
              do {
                if ((local_31 & 1) == 0) {
LAB_0010633f:
                  local_2c43 = true;
                  if ((local_32 & 1) != 0) {
                    local_2c43 = sptk::ReadStream<double>
                                           (SUB81((ulong)in_stack_ffffffffffffd350 >> 0x30,0),
                                            (int)in_stack_ffffffffffffd350,in_stack_ffffffffffffd34c
                                            ,in_stack_ffffffffffffd348,
                                            (vector<double,_std::allocator<double>_> *)
                                            in_stack_ffffffffffffd340,in_stack_ffffffffffffd338,
                                            in_stack_ffffffffffffd360);
                  }
                  local_2c42 = local_2c43;
                }
                else {
                  bVar2 = sptk::ReadStream<double>
                                    (SUB81((ulong)in_stack_ffffffffffffd350 >> 0x30,0),
                                     (int)in_stack_ffffffffffffd350,in_stack_ffffffffffffd34c,
                                     in_stack_ffffffffffffd348,
                                     (vector<double,_std::allocator<double>_> *)
                                     in_stack_ffffffffffffd340,in_stack_ffffffffffffd338,
                                     in_stack_ffffffffffffd360);
                  local_2c42 = false;
                  if (bVar2) goto LAB_0010633f;
                }
                if (local_2c42 == false) {
                  local_ea0 = 0;
                  goto LAB_001066bc;
                }
                bVar2 = sptk::FilterCoefficientsToSpectrum::Run
                                  ((FilterCoefficientsToSpectrum *)
                                   CONCAT17(in_stack_ffffffffffffd4ef,
                                            CONCAT16(in_stack_ffffffffffffd4ee,
                                                     CONCAT15(in_stack_ffffffffffffd4ed,
                                                              in_stack_ffffffffffffd4e8))),
                                   in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,
                                   (vector<double,_std::allocator<double>_> *)
                                   in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream(local_1c68);
                  std::operator<<((ostream *)local_1c68,
                                  "Failed to transform filter coefficients to spectrum");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_1c88,"spec",&local_1c89);
                  sptk::PrintErrorMessage
                            (in_stack_ffffffffffffd4f0,
                             (ostringstream *)
                             CONCAT17(in_stack_ffffffffffffd4ef,
                                      CONCAT16(in_stack_ffffffffffffd4ee,
                                               CONCAT15(in_stack_ffffffffffffd4ed,
                                                        in_stack_ffffffffffffd4e8))));
                  std::__cxx11::string::~string(local_1c88);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1c89);
                  local_4 = 1;
                  local_ea0 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_1c68);
                  goto LAB_001066bc;
                }
                bVar2 = sptk::WriteStream<double>
                                  ((int)in_stack_ffffffffffffd350,in_stack_ffffffffffffd34c,
                                   (vector<double,_std::allocator<double>_> *)
                                   in_stack_ffffffffffffd340,(ostream *)in_stack_ffffffffffffd338,
                                   in_stack_ffffffffffffd330);
              } while (bVar2);
              std::__cxx11::ostringstream::ostringstream(local_1e08);
              std::operator<<((ostream *)local_1e08,"Failed to write spectrum");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1e28,"spec",&local_1e29);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffd4f0,
                         (ostringstream *)
                         CONCAT17(in_stack_ffffffffffffd4ef,
                                  CONCAT16(in_stack_ffffffffffffd4ee,
                                           CONCAT15(in_stack_ffffffffffffd4ed,
                                                    in_stack_ffffffffffffd4e8))));
              std::__cxx11::string::~string(local_1e28);
              std::allocator<char>::~allocator((allocator<char> *)&local_1e29);
              local_4 = 1;
              local_ea0 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_1e08);
LAB_001066bc:
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd310);
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_1aa8);
              std::operator<<((ostream *)local_1aa8,"Failed to set condition for transformation");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1ac8,"spec",&local_1ac9);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffd4f0,
                         (ostringstream *)
                         CONCAT17(in_stack_ffffffffffffd4ef,
                                  CONCAT16(in_stack_ffffffffffffd4ee,
                                           CONCAT15(in_stack_ffffffffffffd4ed,
                                                    in_stack_ffffffffffffd4e8))));
              std::__cxx11::string::~string(local_1ac8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1ac9);
              local_4 = 1;
              local_ea0 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_1aa8);
            }
            sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer((Buffer *)in_stack_ffffffffffffd300)
            ;
            sptk::FilterCoefficientsToSpectrum::~FilterCoefficientsToSpectrum
                      ((FilterCoefficientsToSpectrum *)in_stack_ffffffffffffd300);
          }
          else {
            std::operator|(_S_in,_S_bin);
            std::ifstream::open(local_1600,(_Ios_Openmode)pcVar1);
            bVar3 = std::ios::fail();
            if ((bVar3 & 1) == 0) goto LAB_00106066;
            std::__cxx11::ostringstream::ostringstream(local_1778);
            poVar4 = std::operator<<((ostream *)local_1778,"Cannot open file ");
            std::operator<<(poVar4,local_30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1798,"spec",&local_1799);
            sptk::PrintErrorMessage
                      (in_stack_ffffffffffffd4f0,
                       (ostringstream *)
                       CONCAT17(in_stack_ffffffffffffd4ef,
                                CONCAT16(in_stack_ffffffffffffd4ee,
                                         CONCAT15(in_stack_ffffffffffffd4ed,
                                                  in_stack_ffffffffffffd4e8))));
            std::__cxx11::string::~string(local_1798);
            std::allocator<char>::~allocator((allocator<char> *)&local_1799);
            local_4 = 1;
            local_ea0 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1778);
          }
          std::ifstream::~ifstream(local_1600);
        }
        else {
          std::operator|(_S_in,_S_bin);
          std::ifstream::open(local_1250,(_Ios_Openmode)pcVar1);
          bVar3 = std::ios::fail();
          if ((bVar3 & 1) == 0) goto LAB_00105df7;
          std::__cxx11::ostringstream::ostringstream(local_13c8);
          poVar4 = std::operator<<((ostream *)local_13c8,"Cannot open file ");
          std::operator<<(poVar4,local_28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_13e8,"spec",&local_13e9);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffd4f0,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffd4ef,
                              CONCAT16(in_stack_ffffffffffffd4ee,
                                       CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)
                                      )));
          std::__cxx11::string::~string(local_13e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_13e9);
          local_4 = 1;
          local_ea0 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_13c8);
        }
        std::ifstream::~ifstream(local_1250);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1020);
        std::operator<<((ostream *)local_1020,"Too many input files");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1040,"spec",&local_1041);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd4f0,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffd4ef,
                            CONCAT16(in_stack_ffffffffffffd4ee,
                                     CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)))
                  );
        std::__cxx11::string::~string(local_1040);
        std::allocator<char>::~allocator((allocator<char> *)&local_1041);
        local_4 = 1;
        local_ea0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1020);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_e78);
      std::operator<<((ostream *)local_e78,
                      "Numerator and denominator coefficient files are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e98,"spec",&local_e99);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffd4f0,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffd4ef,
                          CONCAT16(in_stack_ffffffffffffd4ee,
                                   CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8))));
      std::__cxx11::string::~string(local_e98);
      std::allocator<char>::~allocator((allocator<char> *)&local_e99);
      local_4 = 1;
      local_ea0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_e78);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd310);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd310);
    goto joined_r0x00107123;
  }
  local_1e30 = local_8 - ya_optind;
  if (1 < local_1e30) {
    std::__cxx11::ostringstream::ostringstream(local_1fa8);
    std::operator<<((ostream *)local_1fa8,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1fc8,"spec",&local_1fc9);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd4f0,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd4ef,
                        CONCAT16(in_stack_ffffffffffffd4ee,
                                 CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8))));
    std::__cxx11::string::~string(local_1fc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1fc9);
    local_4 = 1;
    local_ea0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1fa8);
    return local_4;
  }
  if (local_1e30 == 0) {
    local_2c78 = (char *)0x0;
  }
  else {
    local_2c78 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_1fd8 = local_2c78;
  std::ifstream::ifstream(local_21e0);
  pcVar1 = local_1fd8;
  if (local_1fd8 == (char *)0x0) {
LAB_00106af9:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      this_00 = (WaveformToSpectrum *)&std::cin;
    }
    else {
      this_00 = local_21e0;
    }
    local_2388 = this_00;
    sptk::WaveformToSpectrum::WaveformToSpectrum
              (this_00,in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348,
               (InputOutputFormats)((ulong)in_stack_ffffffffffffd340 >> 0x20),
               (double)in_stack_ffffffffffffd338,(double)in_stack_ffffffffffffd330);
    sptk::WaveformToSpectrum::Buffer::Buffer((Buffer *)0x106b7e);
    bVar2 = sptk::WaveformToSpectrum::IsValid((WaveformToSpectrum *)0x106b8d);
    read_point = CONCAT13(bVar2,(int3)in_stack_ffffffffffffd34c);
    if (bVar2) {
      local_26d8 = local_14 / 2 + 1;
      actual_write_size = (int *)(long)local_14;
      input_stream_00 = local_26f1;
      std::allocator<double>::allocator((allocator<double> *)0x106d22);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffd320,
                 CONCAT17(in_stack_ffffffffffffd31f,
                          CONCAT16(in_stack_ffffffffffffd31e,in_stack_ffffffffffffd318)),
                 (allocator_type *)in_stack_ffffffffffffd310);
      std::allocator<double>::~allocator((allocator<double> *)0x106d48);
      this = (vector<double,_std::allocator<double>_> *)(long)local_26d8;
      std::allocator<double>::allocator((allocator<double> *)0x106d67);
      std::vector<double,_std::allocator<double>_>::vector
                (this,CONCAT17(in_stack_ffffffffffffd31f,
                               CONCAT16(in_stack_ffffffffffffd31e,in_stack_ffffffffffffd318)),
                 (allocator_type *)in_stack_ffffffffffffd310);
      std::allocator<double>::~allocator((allocator<double> *)0x106d8d);
      do {
        buffer_00 = (Buffer *)0x0;
        bVar2 = sptk::ReadStream<double>
                          (SUB81((ulong)this_00 >> 0x30,0),(int)this_00,read_point,
                           in_stack_ffffffffffffd348,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd340,
                           input_stream_00,in_stack_ffffffffffffd360);
        if (!bVar2) {
          local_ea0 = 0;
          goto LAB_001070d9;
        }
        bVar2 = sptk::WaveformToSpectrum::Run
                          (in_stack_ffffffffffffd310,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_ffffffffffffd30f,in_stack_ffffffffffffd308),
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd300,
                           buffer_00);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream(local_2890);
          std::operator<<((ostream *)local_2890,"Failed to transform waveform to spectrum");
          in_stack_ffffffffffffd310 = (WaveformToSpectrum *)local_28b1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_28b1 + 1),"spec",(allocator *)in_stack_ffffffffffffd310);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffd4f0,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffd4ef,
                              CONCAT16(in_stack_ffffffffffffd4ee,
                                       CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8)
                                      )));
          std::__cxx11::string::~string((string *)(local_28b1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_28b1);
          local_4 = 1;
          local_ea0 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_2890);
          goto LAB_001070d9;
        }
        in_stack_ffffffffffffd30f =
             sptk::WriteStream<double>
                       ((int)this_00,read_point,
                        (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd340,
                        (ostream *)input_stream_00,actual_write_size);
      } while ((bool)in_stack_ffffffffffffd30f);
      std::__cxx11::ostringstream::ostringstream(local_2a30);
      std::operator<<((ostream *)local_2a30,"Failed to write spectrum");
      in_stack_ffffffffffffd300 = (WaveformToSpectrum *)local_2a51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_2a51 + 1),"spec",(allocator *)in_stack_ffffffffffffd300);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffd4f0,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffd4ef,
                          CONCAT16(in_stack_ffffffffffffd4ee,
                                   CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8))));
      std::__cxx11::string::~string((string *)(local_2a51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2a51);
      local_4 = 1;
      local_ea0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2a30);
LAB_001070d9:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd310);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd310);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_26b0);
      std::operator<<((ostream *)local_26b0,"Failed to set condition for transformation");
      paVar6 = &local_26d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_26d0,"spec",paVar6);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffd4f0,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffd4ef,
                          CONCAT16(in_stack_ffffffffffffd4ee,
                                   CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8))));
      std::__cxx11::string::~string(local_26d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_26d1);
      local_4 = 1;
      local_ea0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_26b0);
    }
    sptk::WaveformToSpectrum::Buffer::~Buffer((Buffer *)0x107100);
    sptk::WaveformToSpectrum::~WaveformToSpectrum(in_stack_ffffffffffffd300);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_21e0,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_00106af9;
    std::__cxx11::ostringstream::ostringstream(local_2358);
    poVar4 = std::operator<<((ostream *)local_2358,"Cannot open file ");
    std::operator<<(poVar4,local_1fd8);
    paVar6 = &local_2379;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2378,"spec",paVar6);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffd4f0,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffd4ef,
                        CONCAT16(in_stack_ffffffffffffd4ee,
                                 CONCAT15(in_stack_ffffffffffffd4ed,in_stack_ffffffffffffd4e8))));
    std::__cxx11::string::~string(local_2378);
    std::allocator<char>::~allocator((allocator<char> *)&local_2379);
    local_4 = 1;
    local_ea0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_2358);
  }
  std::ifstream::~ifstream(local_21e0);
joined_r0x00107123:
  if (local_ea0 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_numerator_order(kDefaultNumNumeratorOrder);
  int num_denominator_order(kDefaultNumDenominatorOrder);
  const char* numerator_coefficients_file(NULL);
  const char* denominator_coefficients_file(NULL);
  bool is_numerator_specified(false);
  bool is_denominator_specified(false);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);
  sptk::SpectrumToSpectrum::InputOutputFormats output_format(
      kDefaultOutputFormat);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:n:z:p:e:E:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_numerator_order) ||
            num_numerator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        is_numerator_specified = true;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_denominator_order) ||
            num_denominator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -n option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        is_denominator_specified = true;
        break;
      }
      case 'z': {
        numerator_coefficients_file = optarg;
        is_numerator_specified = true;
        break;
      }
      case 'p': {
        denominator_coefficients_file = optarg;
        is_denominator_specified = true;
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::SpectrumToSpectrum::kNumInputOutputFormats) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("spec", error_message);
          return 1;
        }
        output_format =
            static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("spec", error_message);
    return 1;
  }

  if (is_numerator_specified || is_denominator_specified) {
    const int numerator_length(num_numerator_order + 1);
    const int denominator_length(num_denominator_order + 1);
    std::vector<double> numerator_coefficients(numerator_length);
    std::vector<double> denominator_coefficients(denominator_length);

    if (is_numerator_specified && is_denominator_specified &&
        (NULL == numerator_coefficients_file ||
         NULL == denominator_coefficients_file)) {
      std::ostringstream error_message;
      error_message
          << "Numerator and denominator coefficient files are required";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int num_input_files(argc - optind);
    if (0 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    std::ifstream ifs_for_numerator;
    if (is_numerator_specified && NULL != numerator_coefficients_file) {
      ifs_for_numerator.open(numerator_coefficients_file,
                             std::ios::in | std::ios::binary);
      if (ifs_for_numerator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << numerator_coefficients_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    } else {
      numerator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_numerator(
        ifs_for_numerator.is_open() ? ifs_for_numerator : std::cin);

    std::ifstream ifs_for_denominator;
    if (is_denominator_specified && NULL != denominator_coefficients_file) {
      ifs_for_denominator.open(denominator_coefficients_file,
                               std::ios::in | std::ios::binary);
      if (ifs_for_denominator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << denominator_coefficients_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    } else {
      denominator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_denominator(
        ifs_for_denominator.is_open() ? ifs_for_denominator : std::cin);

    sptk::FilterCoefficientsToSpectrum filter_coefficients_to_spectrum(
        num_numerator_order, num_denominator_order, fft_length, output_format,
        epsilon, relative_floor_in_decibels);
    sptk::FilterCoefficientsToSpectrum::Buffer buffer;
    if (!filter_coefficients_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to set condition for transformation";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> output(output_length);
    while ((!is_numerator_specified ||
            sptk::ReadStream(false, 0, 0, numerator_length,
                             &numerator_coefficients,
                             &input_stream_for_numerator, NULL)) &&
           (!is_denominator_specified ||
            sptk::ReadStream(false, 0, 0, denominator_length,
                             &denominator_coefficients,
                             &input_stream_for_denominator, NULL))) {
      if (!filter_coefficients_to_spectrum.Run(numerator_coefficients,
                                               denominator_coefficients,
                                               &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform filter coefficients to spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
  } else {
    const int num_input_files(argc - optind);
    if (1 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }
    const char* input_file(0 == num_input_files ? NULL : argv[optind]);

    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    sptk::WaveformToSpectrum waveform_to_spectrum(fft_length, fft_length,
                                                  output_format, epsilon,
                                                  relative_floor_in_decibels);
    sptk::WaveformToSpectrum::Buffer buffer;
    if (!waveform_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to set condition for transformation";
      sptk::PrintErrorMessage("spec", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> waveform(fft_length);
    std::vector<double> output(output_length);
    while (sptk::ReadStream(true, 0, 0, fft_length, &waveform, &input_stream,
                            NULL)) {
      if (!waveform_to_spectrum.Run(waveform, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write spectrum";
        sptk::PrintErrorMessage("spec", error_message);
        return 1;
      }
    }
  }

  return 0;
}